

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

x86Reg GenCodeLoadInt32FromPointerIntoRegister(CodeGenRegVmContext *ctx,uchar reg,uint offset)

{
  uint num;
  x86Reg xVar1;
  x86Reg reg1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,reg);
  if (iVar2 == 1) {
    xVar1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rR15,offset,true);
    if (xVar1 != rRegCount) {
      return xVar1;
    }
    reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
    xVar1 = rR15;
  }
  else {
    if (iVar2 == 2) {
      xVar1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rR14,offset,true);
      if (xVar1 != rRegCount) {
        return xVar1;
      }
      xVar1 = CodeGenGenericContext::GetReg(&ctx->ctx);
      num = *(uint *)((long)ctx->exRegVmConstants + (ulong)(offset & 0xfffffffc));
      if (num != 0) {
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,xVar1,num);
        return xVar1;
      }
      EMIT_OP_REG_REG(&ctx->ctx,o_xor,xVar1,xVar1);
      return xVar1;
    }
    if (iVar2 == 3) {
      xVar1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,offset,true);
      if (xVar1 != rRegCount) {
        return xVar1;
      }
      reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
      xVar1 = rEBX;
    }
    else {
      reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,(uint)reg << 3);
      xVar1 = reg1;
    }
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,reg1,sDWORD,xVar1,offset);
  return reg1;
}

Assistant:

x86Reg GenCodeLoadInt32FromPointerIntoRegister(CodeGenRegVmContext &ctx, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrFrame)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rR15, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rR15, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrConstants)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rR14, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		// Load int immediate
		int value = ctx.exRegVmConstants[offset >> 2];

		if(value == 0)
			EMIT_OP_REG_REG(ctx.ctx, o_xor, targetReg, targetReg);
		else
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, targetReg, value);

		return targetReg;
	}

	x86Reg targetReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, reg * 8); // Load source pointer
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, targetReg, offset); // Load int value

	return targetReg;
}